

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktSampleVerifierUtil.cpp
# Opt level: O0

void vkt::texture::util::wrapCubemapEdge
               (IVec2 *coord,IVec2 *size,int faceNdx,IVec2 *newCoord,int *newFaceNdx)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int *piVar4;
  Vector<int,_2> local_58;
  Vector<int,_2> local_50;
  Vector<int,_2> local_48;
  IVec2 edgeOffset;
  IVec2 edgeFactor;
  int adjacentEdgeNdx;
  int edgeNdx;
  int *newFaceNdx_local;
  IVec2 *newCoord_local;
  int faceNdx_local;
  IVec2 *size_local;
  IVec2 *coord_local;
  
  piVar4 = tcu::Vector<int,_2>::operator[](coord,1);
  if (*piVar4 < 0) {
    edgeFactor.m_data[1] = 0;
  }
  else {
    piVar4 = tcu::Vector<int,_2>::operator[](coord,0);
    if (*piVar4 < 1) {
      piVar4 = tcu::Vector<int,_2>::operator[](coord,1);
      if (*piVar4 < 1) {
        edgeFactor.m_data[1] = 3;
      }
      else {
        edgeFactor.m_data[1] = 2;
      }
    }
    else {
      edgeFactor.m_data[1] = 1;
    }
  }
  iVar1 = *(int *)((anonymous_namespace)::adjacentEdges +
                  (long)edgeFactor.m_data[1] * 4 + (long)faceNdx * 0x10);
  tcu::Vector<int,_2>::Vector
            (&edgeOffset,*(int *)((anonymous_namespace)::edgeFactors + (long)iVar1 * 8),
             *(int *)((anonymous_namespace)::edgeFactors + (long)iVar1 * 8 + 4));
  tcu::Vector<int,_2>::Vector(&local_58,1);
  tcu::operator-((tcu *)&local_50,size,&local_58);
  tcu::operator*((tcu *)&local_48,&edgeOffset,&local_50);
  if (*(int *)((anonymous_namespace)::adjacentEdgeDirs +
              (long)edgeFactor.m_data[1] * 4 + (long)faceNdx * 0x10) < 1) {
    piVar4 = tcu::Vector<int,_2>::operator[]
                       (size,*(int *)((anonymous_namespace)::edgeComponent +
                                     (long)edgeFactor.m_data[1] * 4));
    iVar2 = *piVar4;
    piVar4 = tcu::Vector<int,_2>::operator[]
                       (coord,*(int *)((anonymous_namespace)::edgeComponent +
                                      (long)edgeFactor.m_data[1] * 4));
    iVar3 = *piVar4;
    piVar4 = tcu::Vector<int,_2>::operator[]
                       (newCoord,*(int *)((anonymous_namespace)::edgeComponent + (long)iVar1 * 4));
    *piVar4 = (iVar2 - iVar3) + -1;
  }
  else {
    piVar4 = tcu::Vector<int,_2>::operator[]
                       (coord,*(int *)((anonymous_namespace)::edgeComponent +
                                      (long)edgeFactor.m_data[1] * 4));
    iVar2 = *piVar4;
    piVar4 = tcu::Vector<int,_2>::operator[]
                       (newCoord,*(int *)((anonymous_namespace)::edgeComponent + (long)iVar1 * 4));
    *piVar4 = iVar2;
  }
  piVar4 = tcu::Vector<int,_2>::operator[]
                     (newCoord,1 - *(int *)((anonymous_namespace)::edgeComponent + (long)iVar1 * 4))
  ;
  *piVar4 = 0;
  tcu::Vector<int,_2>::operator+=(newCoord,&local_48);
  *newFaceNdx = *(int *)((anonymous_namespace)::adjacentFaces +
                        (long)edgeFactor.m_data[1] * 4 + (long)faceNdx * 0x10);
  return;
}

Assistant:

void wrapCubemapEdge (const IVec2&	coord,
					  const IVec2&	size,
					  const int		faceNdx,
					  IVec2&		newCoord,
					  int&			newFaceNdx)
{
	int edgeNdx = -1;

	if (coord[1] < 0)
	{
		edgeNdx = 0;
	}
	else if (coord[0] > 0)
	{
		edgeNdx = 1;
	}
	else if (coord[1] > 0)
	{
		edgeNdx = 2;
	}
	else
	{
		edgeNdx = 3;
	}

	const int		adjacentEdgeNdx = adjacentEdges[faceNdx][edgeNdx];
	const IVec2		edgeFactor		= IVec2(edgeFactors[adjacentEdgeNdx][0],
											edgeFactors[adjacentEdgeNdx][1]);
	const IVec2		edgeOffset		= edgeFactor * (size - IVec2(1));

	if (adjacentEdgeDirs[faceNdx][edgeNdx] > 0)
	{
		newCoord[edgeComponent[adjacentEdgeNdx]] = coord[edgeComponent[edgeNdx]];
	}
	else
	{
		newCoord[edgeComponent[adjacentEdgeNdx]] =
		    size[edgeComponent[edgeNdx]] - coord[edgeComponent[edgeNdx]] - 1;
	}

	newCoord[1 - edgeComponent[adjacentEdgeNdx]] = 0;
	newCoord += edgeOffset;

	newFaceNdx = adjacentFaces[faceNdx][edgeNdx];
}